

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_function_info.cpp
# Opt level: O2

void __thiscall
duckdb::AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo
          (AddTableFunctionOverloadInfo *this,AlterEntryData *data,TableFunctionSet *new_overloads_p
          )

{
  AlterEntryData local_80;
  
  AlterEntryData::AlterEntryData(&local_80,data);
  AlterTableFunctionInfo::AlterTableFunctionInfo
            (&this->super_AlterTableFunctionInfo,ADD_FUNCTION_OVERLOADS,&local_80);
  AlterEntryData::~AlterEntryData(&local_80);
  (this->super_AlterTableFunctionInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddTableFunctionOverloadInfo_02792290;
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&(this->new_overloads).super_FunctionSet<duckdb::TableFunction>,
             &new_overloads_p->super_FunctionSet<duckdb::TableFunction>);
  (this->super_AlterTableFunctionInfo).super_AlterInfo.allow_internal = true;
  return;
}

Assistant:

AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo(AlterEntryData data, TableFunctionSet new_overloads_p)
    : AlterTableFunctionInfo(AlterTableFunctionType::ADD_FUNCTION_OVERLOADS, std::move(data)),
      new_overloads(std::move(new_overloads_p)) {
	this->allow_internal = true;
}